

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O1

TIFFReadDirEntryErr TIFFReadDirEntryShort(TIFF *tif,TIFFDirEntry *direntry,uint16_t *value)

{
  ushort uVar1;
  TIFFReadDirEntryErr TVar2;
  ulong in_RAX;
  bool bVar3;
  int16_t m;
  undefined8 local_18;
  
  if (direntry->tdir_count != 1) {
    return TIFFReadDirEntryErrCount;
  }
  TVar2 = TIFFReadDirEntryErrType;
  local_18 = in_RAX;
  switch(direntry->tdir_type) {
  case 1:
    local_18._0_4_ = (uint)*(byte *)&direntry->tdir_offset;
    break;
  default:
    goto switchD_00296da3_caseD_2;
  case 3:
    *value = (direntry->tdir_offset).toff_short;
    if ((tif->tif_flags & 0x80) == 0) {
      return TIFFReadDirEntryErrOk;
    }
    TIFFSwabShort(value);
    return TIFFReadDirEntryErrOk;
  case 4:
  case 9:
    local_18 = CONCAT44((int)(in_RAX >> 0x20),(direntry->tdir_offset).toff_long);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabLong((uint32_t *)&local_18);
    }
    bVar3 = 0xffff < (uint)local_18;
    if (bVar3) goto LAB_00296e3a;
    break;
  case 6:
    TVar2 = (direntry->tdir_offset).toff_long >> 5 & TIFFReadDirEntryErrRange;
    if (TVar2 != TIFFReadDirEntryErrOk) {
      return TVar2;
    }
    local_18._0_4_ = (int)(char)(direntry->tdir_offset).toff_long;
    break;
  case 8:
    local_18 = CONCAT62((int6)(in_RAX >> 0x10),(direntry->tdir_offset).toff_short);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabShort((uint16_t *)&local_18);
    }
    uVar1 = (ushort)local_18 >> 0xd;
    local_18._0_4_ = (uint)(ushort)local_18;
    if ((uVar1 & 4) != 0) {
      return uVar1 & TIFFReadDirEntryErrRange;
    }
    break;
  case 0x10:
    TVar2 = TIFFReadDirEntryCheckedLong8(tif,direntry,&local_18);
    goto LAB_00296e1e;
  case 0x11:
    TVar2 = TIFFReadDirEntryCheckedSlong8(tif,direntry,&local_18);
LAB_00296e1e:
    if (TVar2 != TIFFReadDirEntryErrOk) {
      return TVar2;
    }
    bVar3 = 0xffff < local_18;
    if (bVar3) {
LAB_00296e3a:
      return (uint)bVar3 << 2;
    }
    *value = (uint16_t)local_18;
    goto LAB_00296e5b;
  }
  *value = (uint16_t)(uint)local_18;
LAB_00296e5b:
  TVar2 = TIFFReadDirEntryErrOk;
switchD_00296da3_caseD_2:
  return TVar2;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryShort(TIFF *tif, TIFFDirEntry *direntry, uint16_t *value)
{
    enum TIFFReadDirEntryErr err;
    if (direntry->tdir_count != 1)
        return (TIFFReadDirEntryErrCount);
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t m;
            TIFFReadDirEntryCheckedByte(tif, direntry, &m);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SBYTE:
        {
            int8_t m;
            TIFFReadDirEntryCheckedSbyte(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeShortSbyte(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SHORT:
            TIFFReadDirEntryCheckedShort(tif, direntry, value);
            return (TIFFReadDirEntryErrOk);
        case TIFF_SSHORT:
        {
            int16_t m;
            TIFFReadDirEntryCheckedSshort(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeShortSshort(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_LONG:
        {
            uint32_t m;
            TIFFReadDirEntryCheckedLong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeShortLong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG:
        {
            int32_t m;
            TIFFReadDirEntryCheckedSlong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeShortSlong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_LONG8:
        {
            uint64_t m;
            err = TIFFReadDirEntryCheckedLong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeShortLong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG8:
        {
            int64_t m;
            err = TIFFReadDirEntryCheckedSlong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeShortSlong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        default:
            return (TIFFReadDirEntryErrType);
    }
}